

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O0

bool __thiscall GmmLib::GmmResourceInfoCommon::IsPresentableformat(GmmResourceInfoCommon *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GMM_PLATFORM_INFO *pGVar2;
  GMM_FORMAT_ENTRY *FormatTable;
  GMM_PLATFORM_INFO *pPlatform;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pGVar2 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar1));
    if (((ulong)(this->Surf).Flags.Gpu >> 0x14 & 1) == 0) {
      this_local._7_1_ = true;
    }
    else if (((int)(this->Surf).Format < 1) || (0x180 < (int)(this->Surf).Format)) {
      this_local._7_1_ = false;
    }
    else if (((*(byte *)&pGVar2->FormatTable[(this->Surf).Format].field_0 >> 2 & 1) == 0) ||
            ((*(byte *)&pGVar2->FormatTable[(this->Surf).Format].field_0 >> 3 & 1) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GmmLib::GmmResourceInfoCommon::IsPresentableformat()
{
    const GMM_PLATFORM_INFO *pPlatform;
    const GMM_FORMAT_ENTRY * FormatTable = NULL;

    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(GetGmmLibContext(), false);

    pPlatform   = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());
    FormatTable = &(pPlatform->FormatTable[0]);

    if(Surf.Flags.Gpu.Presentable == false)
    {
        // When Presentable flag is not set, no reason to check for valid RT
        // platform supported format. Safe to return true.
        return true;
    }

    if((Surf.Format > GMM_FORMAT_INVALID) &&
       (Surf.Format < GMM_RESOURCE_FORMATS))
    {
        if((FormatTable[Surf.Format].RenderTarget) &&
           (FormatTable[Surf.Format].Supported))
        {
            return true;
        }
        else
        {
            GMM_ASSERTDPF(0, "Present flag can only be set w/ a format!");
            return false;
        }
    }

    return false;
}